

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pVal;
  long lVar1;
  u8 uVar2;
  uint uVar3;
  uchar *puVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  sqlite3_str str;
  double local_30;
  
  str.db = context->pOut->db;
  str.mxAlloc = (str.db)->aLimit[0];
  str.zText = (char *)0x0;
  str.nAlloc = 0;
  str.nChar = 0;
  str.accError = '\0';
  str.printfFlags = '\0';
  pVal = *argv;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
         [pVal->flags & 0x3f]) {
  case '\x01':
    puVar4 = (uchar *)sqlite3VdbeIntValue(pVal);
    pcVar6 = "no such rowid: %lld";
    goto LAB_0018c7e4;
  case '\x02':
    dVar9 = sqlite3VdbeRealValue(pVal);
    sqlite3_str_appendf(&str,"%!0.15g");
    if ((ulong)str.nChar != 0) {
      str.zText[str.nChar] = '\0';
      sqlite3AtoF(str.zText,&local_30,str.nChar,'\x01');
      if ((dVar9 != local_30) || (NAN(dVar9) || NAN(local_30))) {
        sqlite3_str_reset(&str);
        sqlite3_str_appendf(&str,"%!0.20e",dVar9);
      }
    }
    break;
  case '\x03':
    puVar4 = sqlite3_value_text(pVal);
    pcVar6 = "bad JSON path: %Q";
LAB_0018c7e4:
    sqlite3_str_appendf(&str,pcVar6 + 0xf,puVar4);
    break;
  case '\x04':
    pvVar5 = sqlite3_value_blob(pVal);
    uVar3 = sqlite3_value_bytes(pVal);
    sqlite3StrAccumEnlarge(&str,(long)(int)uVar3 * 2 + 4);
    if (str.accError == '\0') {
      lVar1 = (long)(int)uVar3 * 2;
      uVar7 = 0;
      uVar8 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        str.zText[uVar7 * 2 + 2] = "0123456789ABCDEF"[*(byte *)((long)pvVar5 + uVar7) >> 4];
        str.zText[uVar7 * 2 + 3] = "0123456789ABCDEF"[*(byte *)((long)pvVar5 + uVar7) & 0xf];
      }
      (str.zText + lVar1 + 2)[0] = '\'';
      (str.zText + lVar1 + 2)[1] = '\0';
      str.nChar = (int)lVar1 + 3;
      str.zText[0] = 'X';
      str.zText[1] = '\'';
    }
    break;
  default:
    sqlite3_str_append(&str,"NULL",4);
  }
  pcVar6 = sqlite3StrAccumFinish(&str);
  sqlite3_result_text(context,pcVar6,str.nChar,sqlite3OomClear);
  uVar2 = str.accError;
  if (str.accError == '\0') {
    return;
  }
  sqlite3_result_null(context);
  sqlite3_result_error_code(context,(uint)uVar2);
  return;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  sqlite3_str str;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  sqlite3QuoteValue(&str,argv[0]);
  sqlite3_result_text(context, sqlite3StrAccumFinish(&str), str.nChar,
                      SQLITE_DYNAMIC);
  if( str.accError!=SQLITE_OK ){
    sqlite3_result_null(context);
    sqlite3_result_error_code(context, str.accError);
  }
}